

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_rpc_parse_reply(char *buf,int len,json_token *toks,int max_toks,mg_rpc_reply *rep,
                      mg_rpc_error *er)

{
  int iVar1;
  int iVar2;
  json_token *pjVar3;
  frozen frozen;
  frozen local_58;
  
  local_58.do_realloc = 0;
  local_58._36_4_ = 0;
  local_58.end = buf + len;
  local_58.num_tokens = 0;
  local_58.max_tokens = max_toks;
  local_58.cur = buf;
  local_58.tokens = toks;
  iVar2 = doit(&local_58);
  iVar1 = (int)local_58.cur - (int)buf;
  if (iVar2 < 0) {
    iVar1 = iVar2;
  }
  rep->result = (json_token *)0x0;
  rep->message = (json_token *)0x0;
  rep->id = (json_token *)0x0;
  er->error_data = (json_token *)0x0;
  er->error_code = (json_token *)0x0;
  er->error_message = (json_token *)0x0;
  er->message = (json_token *)0x0;
  er->id = (json_token *)0x0;
  if (0 < iVar1) {
    pjVar3 = find_json_token(toks,"result");
    rep->result = pjVar3;
    if (pjVar3 == (json_token *)0x0) {
      er->message = toks;
      pjVar3 = find_json_token(toks,"id");
      er->id = pjVar3;
      pjVar3 = find_json_token(toks,"error.code");
      er->error_code = pjVar3;
      pjVar3 = find_json_token(toks,"error.message");
      er->error_message = pjVar3;
      pjVar3 = find_json_token(toks,"error.data");
      er->error_data = pjVar3;
    }
    else {
      rep->message = toks;
      pjVar3 = find_json_token(toks,"id");
      rep->id = pjVar3;
    }
  }
  return iVar1;
}

Assistant:

int mg_rpc_parse_reply(const char *buf, int len, struct json_token *toks,
                       int max_toks, struct mg_rpc_reply *rep,
                       struct mg_rpc_error *er) {
    int n = parse_json(buf, len, toks, max_toks);

    memset(rep, 0, sizeof(*rep));
    memset(er, 0, sizeof(*er));

    if (n > 0) {
        if ((rep->result = find_json_token(toks, "result")) != NULL) {
            rep->message = toks;
            rep->id = find_json_token(toks, "id");
        } else {
            er->message = toks;
            er->id = find_json_token(toks, "id");
            er->error_code = find_json_token(toks, "error.code");
            er->error_message = find_json_token(toks, "error.message");
            er->error_data = find_json_token(toks, "error.data");
        }
    }
    return n;
}